

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O0

string_view __thiscall
bloaty::dwarf::CompilationUnitSizes::ReadInitialLength
          (CompilationUnitSizes *this,string_view *remaining)

{
  string_view sVar1;
  uint uVar2;
  char *str;
  char *pcVar3;
  size_type sVar4;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  uint64_t len;
  string_view unit;
  undefined1 in_stack_ffffffffffffffc0 [16];
  int line;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  this_00 = in_RDI;
  uVar2 = ReadFixed<unsigned_int,4ul>(in_stack_ffffffffffffffc0._0_8_);
  str = (char *)(ulong)uVar2;
  if (str == (char *)0xffffffff) {
    *(undefined1 *)((long)&in_RDI->_M_len + 2) = 1;
    str = (char *)ReadFixed<unsigned_long,8ul>(in_stack_ffffffffffffffc0._0_8_);
  }
  else {
    *(undefined1 *)((long)&in_RDI->_M_len + 2) = 0;
  }
  line = in_stack_ffffffffffffffc0._12_4_;
  pcVar3 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
  if (pcVar3 < str) {
    Throw(str,line);
  }
  local_18._M_len = in_RSI->_M_len;
  local_18._M_str = in_RSI->_M_str;
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
  std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix(&local_18,sVar4 - (long)str);
  bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (this_00,(size_type)in_RSI,(size_type)str);
  in_RSI->_M_len = bVar5._M_len;
  in_RSI->_M_str = bVar5._M_str;
  sVar1._M_str = local_18._M_str;
  sVar1._M_len = local_18._M_len;
  return sVar1;
}

Assistant:

std::string_view CompilationUnitSizes::ReadInitialLength(
    std::string_view* remaining) {
  uint64_t len = ReadFixed<uint32_t>(remaining);

  if (len == 0xffffffff) {
    dwarf64_ = true;
    len = ReadFixed<uint64_t>(remaining);
  } else {
    dwarf64_ = false;
  }

  if (remaining->size() < len) {
    THROW("short DWARF compilation unit");
  }

  std::string_view unit = *remaining;
  unit.remove_suffix(remaining->size() - len);
  *remaining = remaining->substr(len);
  return unit;
}